

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_union_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  uint *puVar7;
  size_t __n;
  uint *puVar8;
  void *pvVar9;
  size_t __n_00;
  char type_name [105];
  flatcc_json_printer_union_descriptor_t local_c0;
  char *local_b0;
  char local_a8 [4];
  undefined1 auStack_a4 [116];
  
  uVar2 = id * 2 + 2;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar3 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar3 != 0)) {
    puVar7 = (uint *)(uVar3 + (long)td->table);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar3 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar3 != 0)) {
    puVar8 = (uint *)(uVar3 + (long)td->table);
  }
  else {
    puVar8 = (uint *)0x0;
  }
  local_c0.ttl = td->ttl;
  if (len < 0x65) {
    local_b0 = name;
    memcpy(local_a8,name,len);
    builtin_strncpy(local_a8 + len,"_typ",4);
    auStack_a4[len] = 0x65;
    if ((puVar8 != (uint *)0x0) && (puVar7 != (uint *)0x0)) {
      flatcc_json_printer_utype_enum_vector_field(ctx,td,id + -1,local_a8,len + 5,ptf);
      iVar4 = td->count;
      td->count = iVar4 + 1;
      if (iVar4 != 0) {
        pcVar5 = ctx->p;
        ctx->p = pcVar5 + 1;
        *pcVar5 = ',';
      }
      uVar3 = (ulong)*puVar8;
      uVar2 = *puVar7;
      iVar4 = *(int *)((long)puVar8 + uVar3);
      print_name(ctx,local_b0,len);
      ctx->level = ctx->level + 1;
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = '[';
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        uVar1 = *(uint8_t *)((long)puVar7 + (ulong)uVar2 + 4);
        if (uVar1 == '\0') {
          pcVar5 = ctx->p;
          ctx->p = pcVar5 + 1;
          *pcVar5 = 'n';
          pcVar5 = ctx->p;
          ctx->p = pcVar5 + 1;
          *pcVar5 = 'u';
          pcVar5 = ctx->p;
          ctx->p = pcVar5 + 1;
          *pcVar5 = 'l';
          pcVar5 = ctx->p;
          ctx->p = pcVar5 + 1;
          *pcVar5 = 'l';
        }
        else {
          local_c0.member = (void *)((long)puVar8 + uVar3 + 4);
          local_c0.type = uVar1;
          (*pf)(ctx,&local_c0);
        }
        iVar4 = iVar4 + -1;
      }
      if (iVar4 != 0) {
        pvVar9 = (void *)((long)puVar8 + uVar3 + 8);
        lVar6 = 0;
        do {
          uVar1 = *(uint8_t *)((long)puVar7 + lVar6 + (ulong)uVar2 + 5);
          pcVar5 = ctx->p;
          ctx->p = pcVar5 + 1;
          *pcVar5 = ',';
          if (uVar1 == '\0') {
            pcVar5 = ctx->p;
            ctx->p = pcVar5 + 1;
            *pcVar5 = 'n';
            pcVar5 = ctx->p;
            ctx->p = pcVar5 + 1;
            *pcVar5 = 'u';
            pcVar5 = ctx->p;
            ctx->p = pcVar5 + 1;
            *pcVar5 = 'l';
            pcVar5 = ctx->p;
            ctx->p = pcVar5 + 1;
            *pcVar5 = 'l';
          }
          else {
            local_c0.member = pvVar9;
            local_c0.type = uVar1;
            (*pf)(ctx,&local_c0);
          }
          lVar6 = lVar6 + 1;
          pvVar9 = (void *)((long)pvVar9 + 4);
        } while (iVar4 != (int)lVar6);
      }
      if (ctx->indent != '\0') {
        pcVar5 = ctx->p;
        ctx->p = pcVar5 + 1;
        *pcVar5 = '\n';
        lVar6 = (long)ctx->level + -1;
        ctx->level = (int)lVar6;
        __n = (ulong)ctx->indent * lVar6;
        pcVar5 = ctx->p;
        if (ctx->pflush < pcVar5 + __n) {
          if (ctx->pflush <= pcVar5) {
            (*ctx->flush)(ctx,0);
          }
          __n_00 = (long)ctx->pflush - (long)ctx->p;
          if (__n_00 < __n) {
            do {
              memset(ctx->p,0x20,__n_00);
              ctx->p = ctx->p + __n_00;
              __n = __n - __n_00;
              (*ctx->flush)(ctx,0);
              __n_00 = (long)ctx->pflush - (long)ctx->p;
            } while (__n_00 < __n);
          }
          pcVar5 = ctx->p;
        }
        memset(pcVar5,0x20,__n);
        ctx->p = ctx->p + __n;
      }
      pcVar5 = ctx->p;
      ctx->p = pcVar5 + 1;
      *pcVar5 = ']';
    }
    return;
  }
  if (ctx->error == 0) {
    ctx->error = 1;
  }
  __assert_fail("0 && \"identifier too long\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                ,0x41c,
                "void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *, flatcc_json_printer_table_descriptor_t *, int, const char *, size_t, flatcc_json_printer_union_type_f *, flatcc_json_printer_union_f *)"
               );
}

Assistant:

void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const uoffset_t *pt = get_field_ptr(td, id - 1);
    const uoffset_t *p = get_field_ptr(td, id);
    utype_t *types, type;
    uoffset_t count;
    char type_name[FLATCC_JSON_PRINT_NAME_LEN_MAX + 5];
    flatcc_json_printer_union_descriptor_t ud;

    ud.ttl = td->ttl;
    if (len > FLATCC_JSON_PRINT_NAME_LEN_MAX) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "identifier too long");
        return;
    }
    memcpy(type_name, name, len);
    memcpy(type_name + len, "_type", 5);
    if (p && pt) {
        flatcc_json_printer_utype_enum_vector_field(ctx, td, id - 1,
                type_name, len + 5, ptf);
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        pt = read_uoffset_ptr(pt);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        ++pt;
        types = (utype_t *)pt;
        print_name(ctx, name, len);
        print_start('[');

        if (count) {
            type = __flatbuffers_utype_read_from_pe(types);
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
            --count;
        }
        while (count--) {
            ++p;
            ++types;
            type = __flatbuffers_utype_read_from_pe(types);
            print_char(',');
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
        }
        print_end(']');
    }
}